

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_types.cc
# Opt level: O0

void __thiscall webrtc::RTPHeader::RTPHeader(RTPHeader *this)

{
  RTPHeader *this_local;
  
  this->markerBit = false;
  this->payloadType = '\0';
  this->sequenceNumber = 0;
  this->timestamp = 0;
  this->ssrc = 0;
  this->numCSRCs = '\0';
  this->paddingLength = 0;
  this->headerLength = 0;
  this->payload_type_frequency = 0;
  RTPHeaderExtension::RTPHeaderExtension(&this->extension);
  memset(this->arrOfCSRCs,0,0x3c);
  return;
}

Assistant:

RTPHeader::RTPHeader()
    : markerBit(false),
      payloadType(0),
      sequenceNumber(0),
      timestamp(0),
      ssrc(0),
      numCSRCs(0),
      paddingLength(0),
      headerLength(0),
      payload_type_frequency(0),
      extension() {
  memset(&arrOfCSRCs, 0, sizeof(arrOfCSRCs));
}